

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse42::
     BVHNIntersector1<4,_1048576,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMiIntersector1Pluecker<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined8 *puVar9;
  undefined8 uVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  Scene *pSVar12;
  float **ppfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  Geometry *pGVar18;
  RTCIntersectArguments *pRVar19;
  byte bVar20;
  byte bVar21;
  byte bVar22;
  byte bVar23;
  byte bVar24;
  byte bVar25;
  byte bVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  byte bVar34;
  float fVar35;
  float fVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined4 uVar39;
  int iVar40;
  ulong uVar41;
  ulong uVar42;
  long lVar43;
  undefined4 uVar44;
  ulong *puVar45;
  ulong uVar46;
  ulong uVar47;
  ulong unaff_RBP;
  size_t mask;
  ulong uVar48;
  ulong uVar49;
  size_t sVar50;
  ulong uVar51;
  ulong uVar52;
  bool bVar53;
  float fVar54;
  float fVar63;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar64;
  float fVar65;
  float fVar66;
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  byte bVar67;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  float fVar68;
  byte bVar74;
  byte bVar76;
  byte bVar77;
  float fVar75;
  float fVar78;
  float fVar79;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar80;
  uint uVar81;
  uint uVar87;
  uint uVar88;
  vint4 ai_1;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  uint uVar90;
  float fVar91;
  uint uVar92;
  float fVar93;
  uint uVar96;
  float fVar97;
  uint uVar98;
  float fVar99;
  vint4 bi;
  undefined1 auVar94 [16];
  uint uVar100;
  undefined1 auVar95 [16];
  float fVar101;
  float fVar102;
  float fVar103;
  uint uVar104;
  float fVar105;
  float fVar106;
  uint uVar107;
  float fVar108;
  float fVar109;
  uint uVar110;
  float fVar111;
  uint uVar112;
  uint uVar113;
  uint uVar117;
  uint uVar118;
  vint4 ai;
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar119;
  uint uVar120;
  undefined1 auVar116 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar125;
  float fVar128;
  float fVar129;
  float fVar130;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar131;
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  undefined1 auVar134 [16];
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar155;
  float fVar156;
  float fVar157;
  undefined1 auVar154 [16];
  float fVar158;
  float fVar159;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar160 [16];
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  UVIdentity<4> mapUV;
  Scene *scene;
  int local_adc;
  float local_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  undefined8 local_ac8;
  float fStack_ac0;
  float fStack_abc;
  ulong local_ab0;
  NodeRef *local_aa8;
  ulong local_aa0;
  ulong local_a98;
  ulong local_a90;
  ulong local_a88;
  ulong local_a80;
  float local_a78;
  float fStack_a74;
  float fStack_a70;
  float fStack_a6c;
  float local_a68;
  float fStack_a64;
  float fStack_a60;
  float fStack_a5c;
  float local_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float local_a48;
  float fStack_a44;
  float fStack_a40;
  float fStack_a3c;
  ulong local_a38;
  ulong local_a30;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  uint local_9c8;
  uint uStack_9c4;
  uint uStack_9c0;
  uint uStack_9bc;
  undefined8 local_8a8;
  undefined8 uStack_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  undefined1 local_878 [16];
  undefined1 local_868 [16];
  UVIdentity<4> *local_858;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  undefined1 local_818 [16];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  NodeRef stack [244];
  
  auVar38 = mm_lookupmask_ps._240_16_;
  if ((*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) &&
     (fStack_a44 = ray->tfar, 0.0 <= fStack_a44)) {
    local_aa8 = stack + 1;
    stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
    fVar35 = (ray->org).field_0.m128[0];
    fVar36 = (ray->org).field_0.m128[1];
    fVar91 = (ray->org).field_0.m128[2];
    aVar11 = (ray->dir).field_0.field_1;
    fVar170 = *(float *)((long)&(ray->org).field_0 + 0xc);
    fVar33 = 0.0;
    if (0.0 <= fVar170) {
      fVar33 = fVar170;
    }
    auVar55._4_4_ = -(uint)(ABS(aVar11.y) < DAT_01ff1d40._4_4_);
    auVar55._0_4_ = -(uint)(ABS(aVar11.x) < (float)DAT_01ff1d40);
    auVar55._8_4_ = -(uint)(ABS(aVar11.z) < DAT_01ff1d40._8_4_);
    auVar55._12_4_ = -(uint)(ABS(aVar11.field_3.w) < DAT_01ff1d40._12_4_);
    auVar82 = blendvps((undefined1  [16])aVar11,_DAT_01ff1d40,auVar55);
    auVar55 = rcpps(auVar55,auVar82);
    fVar102 = auVar55._0_4_;
    fVar105 = auVar55._4_4_;
    fVar108 = auVar55._8_4_;
    fVar102 = (1.0 - auVar82._0_4_ * fVar102) * fVar102 + fVar102;
    fVar105 = (1.0 - auVar82._4_4_ * fVar105) * fVar105 + fVar105;
    fVar108 = (1.0 - auVar82._8_4_ * fVar108) * fVar108 + fVar108;
    local_ab0 = (ulong)(fVar102 < 0.0) << 2;
    uVar48 = local_ab0 ^ 4;
    uVar49 = (ulong)((uint)(fVar105 < 0.0) * 4 + 8);
    uVar47 = uVar49 ^ 4;
    uVar51 = (ulong)((uint)(fVar108 < 0.0) * 4 + 0x10);
    local_aa0 = uVar51 ^ 4;
    local_a48 = fStack_a44;
    fStack_a40 = fStack_a44;
    fStack_a3c = fStack_a44;
    uVar52 = local_aa0;
    fVar170 = fVar91;
    fVar66 = fVar91;
    fVar54 = fVar91;
    local_a98 = uVar51;
    local_a90 = uVar47;
    local_a88 = uVar49;
    local_a80 = uVar48;
    local_a78 = fVar91;
    fStack_a74 = fVar91;
    fStack_a70 = fVar91;
    fStack_a6c = fVar91;
    do {
      if (local_aa8 == stack) {
        return;
      }
      sVar50 = local_aa8[-1].ptr;
      local_aa8 = local_aa8 + -1;
      do {
        if ((sVar50 & 8) == 0) {
          uVar41 = sVar50 & 0xfffffffffffffff0;
          puVar45 = (ulong *)(uVar41 + 0x20);
          if (uVar41 == 0) {
            puVar45 = (ulong *)0x0;
          }
          uVar46 = *puVar45;
          auVar82._8_8_ = 0;
          auVar82._0_8_ = uVar46;
          uVar10 = *(undefined8 *)((long)puVar45 + 4);
          bVar20 = (byte)uVar46;
          bVar67 = (byte)uVar10;
          bVar21 = (byte)(uVar46 >> 8);
          bVar71 = (byte)((ulong)uVar10 >> 8);
          bVar22 = (byte)(uVar46 >> 0x10);
          bVar72 = (byte)((ulong)uVar10 >> 0x10);
          bVar23 = (byte)(uVar46 >> 0x18);
          bVar73 = (byte)((ulong)uVar10 >> 0x18);
          bVar24 = (byte)(uVar46 >> 0x20);
          bVar74 = (byte)((ulong)uVar10 >> 0x20);
          bVar25 = (byte)(uVar46 >> 0x28);
          bVar76 = (byte)((ulong)uVar10 >> 0x28);
          bVar26 = (byte)(uVar46 >> 0x30);
          bVar77 = (byte)((ulong)uVar10 >> 0x30);
          bVar34 = (byte)((ulong)uVar10 >> 0x38);
          bVar27 = (byte)(uVar46 >> 0x38);
          auVar115[0] = -((byte)((bVar20 < bVar67) * bVar20 | (bVar20 >= bVar67) * bVar67) == bVar20
                         );
          auVar115[1] = -((byte)((bVar21 < bVar71) * bVar21 | (bVar21 >= bVar71) * bVar71) == bVar21
                         );
          auVar115[2] = -((byte)((bVar22 < bVar72) * bVar22 | (bVar22 >= bVar72) * bVar72) == bVar22
                         );
          auVar115[3] = -((byte)((bVar23 < bVar73) * bVar23 | (bVar23 >= bVar73) * bVar73) == bVar23
                         );
          auVar115[4] = -((byte)((bVar24 < bVar74) * bVar24 | (bVar24 >= bVar74) * bVar74) == bVar24
                         );
          auVar115[5] = -((byte)((bVar25 < bVar76) * bVar25 | (bVar25 >= bVar76) * bVar76) == bVar25
                         );
          auVar115[6] = -((byte)((bVar26 < bVar77) * bVar26 | (bVar26 >= bVar77) * bVar77) == bVar26
                         );
          auVar115[7] = -((byte)((bVar27 < bVar34) * bVar27 | (bVar27 >= bVar34) * bVar34) == bVar27
                         );
          auVar115[8] = 0xff;
          auVar115[9] = 0xff;
          auVar115[10] = 0xff;
          auVar115[0xb] = 0xff;
          auVar115[0xc] = 0xff;
          auVar115[0xd] = 0xff;
          auVar115[0xe] = 0xff;
          auVar115[0xf] = 0xff;
          auVar83._8_4_ = 0xffffffff;
          auVar83._0_8_ = 0xffffffffffffffff;
          auVar83._12_4_ = 0xffffffff;
          auVar55 = pmovzxbd(auVar82,auVar115 ^ auVar83);
          auVar55 = auVar55 ^ auVar83;
          auVar85._0_4_ = auVar55._0_4_ << 0x1f;
          auVar85._4_4_ = auVar55._4_4_ << 0x1f;
          auVar85._8_4_ = auVar55._8_4_ << 0x1f;
          auVar85._12_4_ = auVar55._12_4_ << 0x1f;
          uVar39 = movmskps((int)uVar41,auVar85);
          fVar65 = *(float *)(puVar45 + 3);
          fVar89 = *(float *)((long)puVar45 + 0x1c);
          fVar80 = *(float *)((long)puVar45 + 0x24);
          auVar56._8_8_ = 0;
          auVar56._0_8_ = *(ulong *)((long)puVar45 + local_ab0);
          auVar55 = pmovzxbd(auVar56,auVar56);
          auVar57._8_8_ = 0;
          auVar57._0_8_ = *(ulong *)((long)puVar45 + uVar48);
          auVar82 = pmovzxbd(auVar57,auVar57);
          fVar119 = *(float *)(puVar45 + 5);
          auVar84._8_8_ = 0;
          auVar84._0_8_ = *(ulong *)((long)puVar45 + uVar49);
          auVar85 = pmovzxbd(auVar84,auVar84);
          auVar86._8_8_ = 0;
          auVar86._0_8_ = *(ulong *)((long)puVar45 + uVar47);
          auVar56 = pmovzxbd(auVar86,auVar86);
          fVar63 = *(float *)((long)puVar45 + 0x2c);
          auVar94._8_8_ = 0;
          auVar94._0_8_ = *(ulong *)((long)puVar45 + uVar51);
          auVar57 = pmovzxbd(auVar94,auVar94);
          auVar114._8_8_ = 0;
          auVar114._0_8_ = *(ulong *)((long)puVar45 + uVar52);
          auVar115 = pmovzxbd(auVar114,auVar114);
          fVar64 = *(float *)(puVar45 + 4);
          fVar68 = (((float)auVar55._0_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar75 = (((float)auVar55._4_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar78 = (((float)auVar55._8_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar79 = (((float)auVar55._12_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar103 = (((float)auVar85._0_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          fVar106 = (((float)auVar85._4_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          fVar109 = (((float)auVar85._8_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          fVar111 = (((float)auVar85._12_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          uVar104 = (uint)((int)fVar103 < (int)fVar68) * (int)fVar68 |
                    (uint)((int)fVar103 >= (int)fVar68) * (int)fVar103;
          uVar107 = (uint)((int)fVar106 < (int)fVar75) * (int)fVar75 |
                    (uint)((int)fVar106 >= (int)fVar75) * (int)fVar106;
          uVar110 = (uint)((int)fVar109 < (int)fVar78) * (int)fVar78 |
                    (uint)((int)fVar109 >= (int)fVar78) * (int)fVar109;
          uVar112 = (uint)((int)fVar111 < (int)fVar79) * (int)fVar79 |
                    (uint)((int)fVar111 >= (int)fVar79) * (int)fVar111;
          fVar68 = (((float)auVar57._0_4_ * fVar63 + fVar64) - fVar91) * fVar108;
          fVar75 = (((float)auVar57._4_4_ * fVar63 + fVar64) - fVar170) * fVar108;
          fVar78 = (((float)auVar57._8_4_ * fVar63 + fVar64) - fVar66) * fVar108;
          fVar79 = (((float)auVar57._12_4_ * fVar63 + fVar64) - fVar54) * fVar108;
          uVar92 = (uint)((int)fVar68 < (int)fVar33) * (int)fVar33 |
                   (uint)((int)fVar68 >= (int)fVar33) * (int)fVar68;
          uVar96 = (uint)((int)fVar75 < (int)fVar33) * (int)fVar33 |
                   (uint)((int)fVar75 >= (int)fVar33) * (int)fVar75;
          uVar98 = (uint)((int)fVar78 < (int)fVar33) * (int)fVar33 |
                   (uint)((int)fVar78 >= (int)fVar33) * (int)fVar78;
          uVar100 = (uint)((int)fVar79 < (int)fVar33) * (int)fVar33 |
                    (uint)((int)fVar79 >= (int)fVar33) * (int)fVar79;
          fVar68 = (((float)auVar82._0_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar75 = (((float)auVar82._4_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar78 = (((float)auVar82._8_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar65 = (((float)auVar82._12_4_ * fVar80 + fVar65) - fVar35) * fVar102;
          fVar80 = (((float)auVar56._0_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          fVar79 = (((float)auVar56._4_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          fVar103 = (((float)auVar56._8_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          fVar89 = (((float)auVar56._12_4_ * fVar119 + fVar89) - fVar36) * fVar105;
          uVar81 = (uint)((int)fVar68 < (int)fVar80) * (int)fVar68 |
                   (uint)((int)fVar68 >= (int)fVar80) * (int)fVar80;
          uVar87 = (uint)((int)fVar75 < (int)fVar79) * (int)fVar75 |
                   (uint)((int)fVar75 >= (int)fVar79) * (int)fVar79;
          uVar88 = (uint)((int)fVar78 < (int)fVar103) * (int)fVar78 |
                   (uint)((int)fVar78 >= (int)fVar103) * (int)fVar103;
          uVar90 = (uint)((int)fVar65 < (int)fVar89) * (int)fVar65 |
                   (uint)((int)fVar65 >= (int)fVar89) * (int)fVar89;
          fVar65 = (((float)auVar115._0_4_ * fVar63 + fVar64) - fVar91) * fVar108;
          fVar89 = (((float)auVar115._4_4_ * fVar63 + fVar64) - fVar170) * fVar108;
          fVar80 = (((float)auVar115._8_4_ * fVar63 + fVar64) - fVar66) * fVar108;
          fVar119 = (((float)auVar115._12_4_ * fVar63 + fVar64) - fVar54) * fVar108;
          uVar113 = (uint)((int)local_a48 < (int)fVar65) * (int)local_a48 |
                    (uint)((int)local_a48 >= (int)fVar65) * (int)fVar65;
          uVar117 = (uint)((int)fStack_a44 < (int)fVar89) * (int)fStack_a44 |
                    (uint)((int)fStack_a44 >= (int)fVar89) * (int)fVar89;
          uVar118 = (uint)((int)fStack_a40 < (int)fVar80) * (int)fStack_a40 |
                    (uint)((int)fStack_a40 >= (int)fVar80) * (int)fVar80;
          uVar120 = (uint)((int)fStack_a3c < (int)fVar119) * (int)fStack_a3c |
                    (uint)((int)fStack_a3c >= (int)fVar119) * (int)fVar119;
          auVar95._0_4_ =
               -(uint)((int)(((int)uVar81 < (int)uVar113) * uVar81 |
                            ((int)uVar81 >= (int)uVar113) * uVar113) <
                      (int)(((int)uVar92 < (int)uVar104) * uVar104 |
                           ((int)uVar92 >= (int)uVar104) * uVar92));
          auVar95._4_4_ =
               -(uint)((int)(((int)uVar87 < (int)uVar117) * uVar87 |
                            ((int)uVar87 >= (int)uVar117) * uVar117) <
                      (int)(((int)uVar96 < (int)uVar107) * uVar107 |
                           ((int)uVar96 >= (int)uVar107) * uVar96));
          auVar95._8_4_ =
               -(uint)((int)(((int)uVar88 < (int)uVar118) * uVar88 |
                            ((int)uVar88 >= (int)uVar118) * uVar118) <
                      (int)(((int)uVar98 < (int)uVar110) * uVar110 |
                           ((int)uVar98 >= (int)uVar110) * uVar98));
          auVar95._12_4_ =
               -(uint)((int)(((int)uVar90 < (int)uVar120) * uVar90 |
                            ((int)uVar90 >= (int)uVar120) * uVar120) <
                      (int)(((int)uVar100 < (int)uVar112) * uVar112 |
                           ((int)uVar100 >= (int)uVar112) * uVar100));
          uVar44 = movmskps((int)puVar45,auVar95);
          unaff_RBP = (ulong)(byte)(~(byte)uVar44 & (byte)uVar39);
        }
        if ((sVar50 & 8) == 0) {
          if (unaff_RBP == 0) {
            iVar40 = 4;
          }
          else {
            uVar41 = sVar50 & 0xfffffffffffffff0;
            lVar43 = 0;
            if (unaff_RBP != 0) {
              for (; (unaff_RBP >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
              }
            }
            iVar40 = 0;
            sVar50 = *(size_t *)(uVar41 + lVar43 * 8);
            uVar46 = unaff_RBP - 1 & unaff_RBP;
            if (uVar46 != 0) {
              local_aa8->ptr = sVar50;
              lVar43 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                }
              }
              uVar42 = uVar46 - 1;
              while( true ) {
                local_aa8 = local_aa8 + 1;
                sVar50 = *(size_t *)(uVar41 + lVar43 * 8);
                uVar42 = uVar42 & uVar46;
                if (uVar42 == 0) break;
                local_aa8->ptr = sVar50;
                lVar43 = 0;
                if (uVar42 != 0) {
                  for (; (uVar42 >> lVar43 & 1) == 0; lVar43 = lVar43 + 1) {
                  }
                }
                uVar46 = uVar42 - 1;
              }
            }
          }
        }
        else {
          iVar40 = 6;
        }
      } while (iVar40 == 0);
      uVar41 = uVar52;
      if (iVar40 == 6) {
        iVar40 = 0;
        local_a38 = (ulong)((uint)sVar50 & 0xf) - 8;
        bVar53 = local_a38 != 0;
        if (bVar53) {
          uVar46 = sVar50 & 0xfffffffffffffff0;
          pSVar12 = context->scene;
          local_a30 = 0;
          do {
            lVar43 = local_a30 * 0x50;
            ppfVar13 = (pSVar12->vertices).items;
            pfVar14 = ppfVar13[*(uint *)(uVar46 + 0x30 + lVar43)];
            pfVar1 = pfVar14 + *(uint *)(uVar46 + lVar43);
            pfVar2 = pfVar14 + *(uint *)(uVar46 + 0x10 + lVar43);
            pfVar14 = pfVar14 + *(uint *)(uVar46 + 0x20 + lVar43);
            pfVar15 = ppfVar13[*(uint *)(uVar46 + 0x34 + lVar43)];
            pfVar3 = pfVar15 + *(uint *)(uVar46 + 4 + lVar43);
            pfVar4 = pfVar15 + *(uint *)(uVar46 + 0x14 + lVar43);
            pfVar15 = pfVar15 + *(uint *)(uVar46 + 0x24 + lVar43);
            pfVar16 = ppfVar13[*(uint *)(uVar46 + 0x38 + lVar43)];
            pfVar5 = pfVar16 + *(uint *)(uVar46 + 8 + lVar43);
            pfVar6 = pfVar16 + *(uint *)(uVar46 + 0x18 + lVar43);
            pfVar16 = pfVar16 + *(uint *)(uVar46 + 0x28 + lVar43);
            pfVar17 = ppfVar13[*(uint *)(uVar46 + 0x3c + lVar43)];
            pfVar7 = pfVar17 + *(uint *)(uVar46 + 0xc + lVar43);
            pfVar8 = pfVar17 + *(uint *)(uVar46 + 0x1c + lVar43);
            pfVar17 = pfVar17 + *(uint *)(uVar46 + 0x2c + lVar43);
            puVar9 = (undefined8 *)(uVar46 + 0x30 + lVar43);
            local_898 = *puVar9;
            uStack_890 = puVar9[1];
            puVar9 = (undefined8 *)(uVar46 + 0x40 + lVar43);
            local_8a8 = *puVar9;
            uStack_8a0 = puVar9[1];
            fVar170 = (ray->org).field_0.m128[0];
            fVar91 = (ray->org).field_0.m128[1];
            fVar66 = (ray->org).field_0.m128[2];
            fVar152 = *pfVar1 - fVar170;
            fVar155 = *pfVar3 - fVar170;
            fVar156 = *pfVar5 - fVar170;
            fVar157 = *pfVar7 - fVar170;
            fVar158 = pfVar1[1] - fVar91;
            fVar161 = pfVar3[1] - fVar91;
            fVar163 = pfVar5[1] - fVar91;
            fVar165 = pfVar7[1] - fVar91;
            fVar171 = pfVar1[2] - fVar66;
            fVar173 = pfVar3[2] - fVar66;
            fVar175 = pfVar5[2] - fVar66;
            fVar177 = pfVar7[2] - fVar66;
            fVar131 = *pfVar2 - fVar170;
            fVar135 = *pfVar4 - fVar170;
            fVar138 = *pfVar6 - fVar170;
            fVar141 = *pfVar8 - fVar170;
            fVar75 = pfVar2[1] - fVar91;
            fVar78 = pfVar4[1] - fVar91;
            fVar79 = pfVar6[1] - fVar91;
            fVar103 = pfVar8[1] - fVar91;
            fVar148 = pfVar2[2] - fVar66;
            fVar149 = pfVar4[2] - fVar66;
            fVar150 = pfVar6[2] - fVar66;
            fVar151 = pfVar8[2] - fVar66;
            fVar167 = *pfVar14 - fVar170;
            fVar168 = *pfVar15 - fVar170;
            fVar169 = *pfVar16 - fVar170;
            fVar170 = *pfVar17 - fVar170;
            fVar106 = pfVar14[1] - fVar91;
            fVar109 = pfVar15[1] - fVar91;
            fVar111 = pfVar16[1] - fVar91;
            fVar91 = pfVar17[1] - fVar91;
            fVar54 = pfVar14[2] - fVar66;
            fVar80 = pfVar15[2] - fVar66;
            fVar63 = pfVar16[2] - fVar66;
            fVar66 = pfVar17[2] - fVar66;
            fVar125 = fVar167 - fVar152;
            fVar128 = fVar168 - fVar155;
            fVar129 = fVar169 - fVar156;
            fVar130 = fVar170 - fVar157;
            fVar144 = fVar106 - fVar158;
            fVar145 = fVar109 - fVar161;
            fVar146 = fVar111 - fVar163;
            fVar147 = fVar91 - fVar165;
            fVar132 = fVar54 - fVar171;
            fVar136 = fVar80 - fVar173;
            fVar139 = fVar63 - fVar175;
            fVar142 = fVar66 - fVar177;
            fVar65 = (ray->dir).field_0.m128[0];
            fStack_ac0 = (ray->dir).field_0.m128[1];
            local_a68 = (ray->dir).field_0.m128[2];
            local_888 = (fVar144 * (fVar54 + fVar171) - fVar132 * (fVar106 + fVar158)) * fVar65 +
                        (fVar132 * (fVar167 + fVar152) - (fVar54 + fVar171) * fVar125) * fStack_ac0
                        + ((fVar106 + fVar158) * fVar125 - (fVar167 + fVar152) * fVar144) *
                          local_a68;
            fStack_884 = (fVar145 * (fVar80 + fVar173) - fVar136 * (fVar109 + fVar161)) * fVar65 +
                         (fVar136 * (fVar168 + fVar155) - (fVar80 + fVar173) * fVar128) * fStack_ac0
                         + ((fVar109 + fVar161) * fVar128 - (fVar168 + fVar155) * fVar145) *
                           local_a68;
            auVar121._0_8_ = CONCAT44(fStack_884,local_888);
            auVar121._8_4_ =
                 (fVar146 * (fVar63 + fVar175) - fVar139 * (fVar111 + fVar163)) * fVar65 +
                 (fVar139 * (fVar169 + fVar156) - (fVar63 + fVar175) * fVar129) * fStack_ac0 +
                 ((fVar111 + fVar163) * fVar129 - (fVar169 + fVar156) * fVar146) * local_a68;
            auVar121._12_4_ =
                 (fVar147 * (fVar66 + fVar177) - fVar142 * (fVar91 + fVar165)) * fVar65 +
                 (fVar142 * (fVar170 + fVar157) - (fVar66 + fVar177) * fVar130) * fStack_ac0 +
                 ((fVar91 + fVar165) * fVar130 - (fVar170 + fVar157) * fVar147) * local_a68;
            local_a58 = fVar158 - fVar75;
            fStack_a54 = fVar161 - fVar78;
            fStack_a50 = fVar163 - fVar79;
            fStack_a4c = fVar165 - fVar103;
            fVar133 = fVar171 - fVar148;
            fVar137 = fVar173 - fVar149;
            fVar140 = fVar175 - fVar150;
            fVar143 = fVar177 - fVar151;
            fVar89 = fVar152 - fVar131;
            fVar119 = fVar155 - fVar135;
            fVar64 = fVar156 - fVar138;
            fVar68 = fVar157 - fVar141;
            fVar172 = (local_a58 * (fVar171 + fVar148) - fVar133 * (fVar158 + fVar75)) * fVar65 +
                      (fVar133 * (fVar152 + fVar131) - (fVar171 + fVar148) * fVar89) * fStack_ac0 +
                      ((fVar158 + fVar75) * fVar89 - (fVar152 + fVar131) * local_a58) * local_a68;
            fVar174 = (fStack_a54 * (fVar173 + fVar149) - fVar137 * (fVar161 + fVar78)) * fVar65 +
                      (fVar137 * (fVar155 + fVar135) - (fVar173 + fVar149) * fVar119) * fStack_ac0 +
                      ((fVar161 + fVar78) * fVar119 - (fVar155 + fVar135) * fStack_a54) * local_a68;
            fVar176 = (fStack_a50 * (fVar175 + fVar150) - fVar140 * (fVar163 + fVar79)) * fVar65 +
                      (fVar140 * (fVar156 + fVar138) - (fVar175 + fVar150) * fVar64) * fStack_ac0 +
                      ((fVar163 + fVar79) * fVar64 - (fVar156 + fVar138) * fStack_a50) * local_a68;
            fVar178 = (fStack_a4c * (fVar177 + fVar151) - fVar143 * (fVar165 + fVar103)) * fVar65 +
                      (fVar143 * (fVar157 + fVar141) - (fVar177 + fVar151) * fVar68) * fStack_ac0 +
                      ((fVar165 + fVar103) * fVar68 - (fVar157 + fVar141) * fStack_a4c) * local_a68;
            fVar159 = fVar131 - fVar167;
            fVar162 = fVar135 - fVar168;
            fVar164 = fVar138 - fVar169;
            fVar166 = fVar141 - fVar170;
            fVar153 = fVar75 - fVar106;
            fStack_ad4 = fVar78 - fVar109;
            fStack_ad0 = fVar79 - fVar111;
            fStack_acc = fVar103 - fVar91;
            fVar93 = fVar148 - fVar54;
            fVar97 = fVar149 - fVar80;
            fVar99 = fVar150 - fVar63;
            fVar101 = fVar151 - fVar66;
            local_ac8 = (RayQueryContext *)CONCAT44(fStack_ac0,fStack_ac0);
            auVar69._0_4_ =
                 (fVar153 * (fVar54 + fVar148) - fVar93 * (fVar106 + fVar75)) * fVar65 +
                 (fVar93 * (fVar167 + fVar131) - (fVar54 + fVar148) * fVar159) * fStack_ac0 +
                 ((fVar106 + fVar75) * fVar159 - (fVar167 + fVar131) * fVar153) * local_a68;
            auVar69._4_4_ =
                 (fStack_ad4 * (fVar80 + fVar149) - fVar97 * (fVar109 + fVar78)) * fVar65 +
                 (fVar97 * (fVar168 + fVar135) - (fVar80 + fVar149) * fVar162) * fStack_ac0 +
                 ((fVar109 + fVar78) * fVar162 - (fVar168 + fVar135) * fStack_ad4) * local_a68;
            auVar69._8_4_ =
                 (fStack_ad0 * (fVar63 + fVar150) - fVar99 * (fVar111 + fVar79)) * fVar65 +
                 (fVar99 * (fVar169 + fVar138) - (fVar63 + fVar150) * fVar164) * fStack_ac0 +
                 ((fVar111 + fVar79) * fVar164 - (fVar169 + fVar138) * fStack_ad0) * local_a68;
            auVar69._12_4_ =
                 (fStack_acc * (fVar66 + fVar151) - fVar101 * (fVar91 + fVar103)) * fVar65 +
                 (fVar101 * (fVar170 + fVar141) - (fVar66 + fVar151) * fVar166) * fStack_ac0 +
                 ((fVar91 + fVar103) * fVar166 - (fVar170 + fVar141) * fStack_acc) * local_a68;
            fVar80 = local_888 + fVar172 + auVar69._0_4_;
            fVar63 = fStack_884 + fVar174 + auVar69._4_4_;
            fVar75 = auVar121._8_4_ + fVar176 + auVar69._8_4_;
            fVar78 = auVar121._12_4_ + fVar178 + auVar69._12_4_;
            auVar58._8_4_ = auVar121._8_4_;
            auVar58._0_8_ = auVar121._0_8_;
            auVar58._12_4_ = auVar121._12_4_;
            auVar30._4_4_ = fVar174;
            auVar30._0_4_ = fVar172;
            auVar30._8_4_ = fVar176;
            auVar30._12_4_ = fVar178;
            auVar55 = minps(auVar58,auVar30);
            auVar55 = minps(auVar55,auVar69);
            auVar31._4_4_ = fVar174;
            auVar31._0_4_ = fVar172;
            auVar31._8_4_ = fVar176;
            auVar31._12_4_ = fVar178;
            auVar82 = maxps(auVar121,auVar31);
            auVar82 = maxps(auVar82,auVar69);
            fVar170 = ABS(fVar80) * 1.1920929e-07;
            fVar91 = ABS(fVar63) * 1.1920929e-07;
            fVar66 = ABS(fVar75) * 1.1920929e-07;
            fVar54 = ABS(fVar78) * 1.1920929e-07;
            auVar122._4_4_ = -(uint)(auVar82._4_4_ <= fVar91);
            auVar122._0_4_ = -(uint)(auVar82._0_4_ <= fVar170);
            auVar122._8_4_ = -(uint)(auVar82._8_4_ <= fVar66);
            auVar122._12_4_ = -(uint)(auVar82._12_4_ <= fVar54);
            auVar59._4_4_ = -(uint)(-fVar91 <= auVar55._4_4_);
            auVar59._0_4_ = -(uint)(-fVar170 <= auVar55._0_4_);
            auVar59._8_4_ = -(uint)(-fVar66 <= auVar55._8_4_);
            auVar59._12_4_ = -(uint)(-fVar54 <= auVar55._12_4_);
            auVar122 = auVar122 | auVar59;
            mapUV = (UVIdentity<4>)0x0;
            local_858 = &mapUV;
            local_9c8 = auVar38._0_4_;
            uStack_9c4 = auVar38._4_4_;
            uStack_9c0 = auVar38._8_4_;
            uStack_9bc = auVar38._12_4_;
            auVar123._0_4_ = auVar122._0_4_ & local_9c8;
            auVar123._4_4_ = auVar122._4_4_ & uStack_9c4;
            auVar123._8_4_ = auVar122._8_4_ & uStack_9c0;
            auVar123._12_4_ = auVar122._12_4_ & uStack_9bc;
            iVar40 = movmskps((int)&mapUV,auVar123);
            fVar91 = local_a78;
            fVar170 = fStack_a74;
            fVar66 = fStack_a70;
            fVar54 = fStack_a6c;
            if (iVar40 != 0) {
              auVar134._0_4_ = local_a58 * fVar93 - fVar133 * fVar153;
              auVar134._4_4_ = fStack_a54 * fVar97 - fVar137 * fStack_ad4;
              auVar134._8_4_ = fStack_a50 * fVar99 - fVar140 * fStack_ad0;
              auVar134._12_4_ = fStack_a4c * fVar101 - fVar143 * fStack_acc;
              auVar60._4_4_ = -(uint)(ABS(fVar136 * fStack_a54) < ABS(fVar137 * fStack_ad4));
              auVar60._0_4_ = -(uint)(ABS(fVar132 * local_a58) < ABS(fVar133 * fVar153));
              auVar60._8_4_ = -(uint)(ABS(fVar139 * fStack_a50) < ABS(fVar140 * fStack_ad0));
              auVar60._12_4_ = -(uint)(ABS(fVar142 * fStack_a4c) < ABS(fVar143 * fStack_acc));
              auVar29._4_4_ = fVar145 * fVar137 - fVar136 * fStack_a54;
              auVar29._0_4_ = fVar144 * fVar133 - fVar132 * local_a58;
              auVar29._8_4_ = fVar146 * fVar140 - fVar139 * fStack_a50;
              auVar29._12_4_ = fVar147 * fVar143 - fVar142 * fStack_a4c;
              local_808 = blendvps(auVar134,auVar29,auVar60);
              auVar116._0_4_ = fVar133 * fVar159 - fVar89 * fVar93;
              auVar116._4_4_ = fVar137 * fVar162 - fVar119 * fVar97;
              auVar116._8_4_ = fVar140 * fVar164 - fVar64 * fVar99;
              auVar116._12_4_ = fVar143 * fVar166 - fVar68 * fVar101;
              auVar61._4_4_ = -(uint)(ABS(fVar128 * fVar137) < ABS(fVar119 * fVar97));
              auVar61._0_4_ = -(uint)(ABS(fVar125 * fVar133) < ABS(fVar89 * fVar93));
              auVar61._8_4_ = -(uint)(ABS(fVar129 * fVar140) < ABS(fVar64 * fVar99));
              auVar61._12_4_ = -(uint)(ABS(fVar130 * fVar143) < ABS(fVar68 * fVar101));
              auVar32._4_4_ = fVar136 * fVar119 - fVar128 * fVar137;
              auVar32._0_4_ = fVar132 * fVar89 - fVar125 * fVar133;
              auVar32._8_4_ = fVar139 * fVar64 - fVar129 * fVar140;
              auVar32._12_4_ = fVar142 * fVar68 - fVar130 * fVar143;
              local_7f8 = blendvps(auVar116,auVar32,auVar61);
              auVar160._0_4_ = fVar89 * fVar153 - local_a58 * fVar159;
              auVar160._4_4_ = fVar119 * fStack_ad4 - fStack_a54 * fVar162;
              auVar160._8_4_ = fVar64 * fStack_ad0 - fStack_a50 * fVar164;
              auVar160._12_4_ = fVar68 * fStack_acc - fStack_a4c * fVar166;
              auVar62._4_4_ = -(uint)(ABS(fVar145 * fVar119) < ABS(fStack_a54 * fVar162));
              auVar62._0_4_ = -(uint)(ABS(fVar144 * fVar89) < ABS(local_a58 * fVar159));
              auVar62._8_4_ = -(uint)(ABS(fVar146 * fVar64) < ABS(fStack_a50 * fVar164));
              auVar62._12_4_ = -(uint)(ABS(fVar147 * fVar68) < ABS(fStack_a4c * fVar166));
              auVar28._4_4_ = fVar128 * fStack_a54 - fVar145 * fVar119;
              auVar28._0_4_ = fVar125 * local_a58 - fVar144 * fVar89;
              auVar28._8_4_ = fVar129 * fStack_a50 - fVar146 * fVar64;
              auVar28._12_4_ = fVar130 * fStack_a4c - fVar147 * fVar68;
              local_7e8 = blendvps(auVar160,auVar28,auVar62);
              fVar89 = fVar65 * local_808._0_4_ +
                       fStack_ac0 * local_7f8._0_4_ + local_a68 * local_7e8._0_4_;
              fVar119 = fVar65 * local_808._4_4_ +
                        fStack_ac0 * local_7f8._4_4_ + local_a68 * local_7e8._4_4_;
              fVar64 = fVar65 * local_808._8_4_ +
                       fStack_ac0 * local_7f8._8_4_ + local_a68 * local_7e8._8_4_;
              fVar65 = fVar65 * local_808._12_4_ +
                       fStack_ac0 * local_7f8._12_4_ + local_a68 * local_7e8._12_4_;
              auVar126._0_4_ = fVar89 + fVar89;
              auVar126._4_4_ = fVar119 + fVar119;
              auVar126._8_4_ = fVar64 + fVar64;
              auVar126._12_4_ = fVar65 + fVar65;
              auVar70._0_4_ = fVar158 * local_7f8._0_4_ + fVar171 * local_7e8._0_4_;
              auVar70._4_4_ = fVar161 * local_7f8._4_4_ + fVar173 * local_7e8._4_4_;
              auVar70._8_4_ = fVar163 * local_7f8._8_4_ + fVar175 * local_7e8._8_4_;
              auVar70._12_4_ = fVar165 * local_7f8._12_4_ + fVar177 * local_7e8._12_4_;
              fVar68 = fVar152 * local_808._0_4_ + auVar70._0_4_;
              fVar79 = fVar155 * local_808._4_4_ + auVar70._4_4_;
              fVar103 = fVar156 * local_808._8_4_ + auVar70._8_4_;
              fVar106 = fVar157 * local_808._12_4_ + auVar70._12_4_;
              auVar55 = rcpps(auVar70,auVar126);
              fVar65 = auVar55._0_4_;
              fVar89 = auVar55._4_4_;
              fVar119 = auVar55._8_4_;
              fVar64 = auVar55._12_4_;
              local_818._0_4_ =
                   ((1.0 - auVar126._0_4_ * fVar65) * fVar65 + fVar65) * (fVar68 + fVar68);
              local_818._4_4_ =
                   ((1.0 - auVar126._4_4_ * fVar89) * fVar89 + fVar89) * (fVar79 + fVar79);
              local_818._8_4_ =
                   ((1.0 - auVar126._8_4_ * fVar119) * fVar119 + fVar119) * (fVar103 + fVar103);
              local_818._12_4_ =
                   ((1.0 - auVar126._12_4_ * fVar64) * fVar64 + fVar64) * (fVar106 + fVar106);
              fVar65 = ray->tfar;
              fVar89 = (ray->org).field_0.m128[3];
              auVar127._0_4_ =
                   (int)((uint)(auVar126._0_4_ != 0.0 &&
                               (local_818._0_4_ <= fVar65 && fVar89 <= local_818._0_4_)) *
                        -0x80000000) >> 0x1f;
              auVar127._4_4_ =
                   (int)((uint)(auVar126._4_4_ != 0.0 &&
                               (local_818._4_4_ <= fVar65 && fVar89 <= local_818._4_4_)) *
                        -0x80000000) >> 0x1f;
              auVar127._8_4_ =
                   (int)((uint)(auVar126._8_4_ != 0.0 &&
                               (local_818._8_4_ <= fVar65 && fVar89 <= local_818._8_4_)) *
                        -0x80000000) >> 0x1f;
              auVar127._12_4_ =
                   (int)((uint)(auVar126._12_4_ != 0.0 &&
                               (local_818._12_4_ <= fVar65 && fVar89 <= local_818._12_4_)) *
                        -0x80000000) >> 0x1f;
              iVar40 = movmskps((int)uVar52,auVar127 & auVar123);
              uVar52 = CONCAT44((int)(uVar52 >> 0x20),iVar40);
              if (iVar40 != 0) {
                fStack_880 = auVar121._8_4_;
                fStack_87c = auVar121._12_4_;
                local_878._4_4_ = fVar174;
                local_878._0_4_ = fVar172;
                local_878._8_4_ = fVar176;
                local_878._12_4_ = fVar178;
                local_868._4_4_ = fVar63;
                local_868._0_4_ = fVar80;
                local_868._8_4_ = fVar75;
                local_868._12_4_ = fVar78;
                local_858 = &mapUV;
                local_848 = auVar127 & auVar123;
                auVar55 = rcpps(local_818,local_868);
                fVar65 = auVar55._0_4_;
                fVar89 = auVar55._4_4_;
                fVar119 = auVar55._8_4_;
                fVar64 = auVar55._12_4_;
                fVar65 = (float)(-(uint)(1e-18 <= ABS(fVar80)) &
                                (uint)(((float)DAT_01feca10 - fVar80 * fVar65) * fVar65 + fVar65));
                fVar89 = (float)(-(uint)(1e-18 <= ABS(fVar63)) &
                                (uint)((DAT_01feca10._4_4_ - fVar63 * fVar89) * fVar89 + fVar89));
                fVar80 = (float)(-(uint)(1e-18 <= ABS(fVar75)) &
                                (uint)((DAT_01feca10._8_4_ - fVar75 * fVar119) * fVar119 + fVar119))
                ;
                fVar119 = (float)(-(uint)(1e-18 <= ABS(fVar78)) &
                                 (uint)((DAT_01feca10._12_4_ - fVar78 * fVar64) * fVar64 + fVar64));
                auVar124._0_4_ = local_888 * fVar65;
                auVar124._4_4_ = fStack_884 * fVar89;
                auVar124._8_4_ = auVar121._8_4_ * fVar80;
                auVar124._12_4_ = auVar121._12_4_ * fVar119;
                local_838 = minps(auVar124,_DAT_01feca10);
                auVar154._0_4_ = fVar65 * fVar172;
                auVar154._4_4_ = fVar89 * fVar174;
                auVar154._8_4_ = fVar80 * fVar176;
                auVar154._12_4_ = fVar119 * fVar178;
                local_828 = minps(auVar154,_DAT_01feca10);
                fStack_abc = fStack_ac0;
                fStack_a64 = local_a68;
                fStack_a60 = local_a68;
                fStack_a5c = local_a68;
                do {
                  uVar47 = 0;
                  if (uVar52 != 0) {
                    for (; (uVar52 >> uVar47 & 1) == 0; uVar47 = uVar47 + 1) {
                    }
                  }
                  h.geomID = *(uint *)((long)&local_898 + uVar47 * 4);
                  pGVar18 = (pSVar12->geometries).items[h.geomID].ptr;
                  if ((pGVar18->mask & ray->mask) == 0) {
                    uVar52 = uVar52 ^ 1L << (uVar47 & 0x3f);
                    bVar37 = true;
                  }
                  else {
                    pRVar19 = context->args;
                    if ((pRVar19->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                      bVar37 = false;
                    }
                    else {
                      h.u = *(float *)(local_838 + uVar47 * 4);
                      h.v = *(float *)(local_828 + uVar47 * 4);
                      args.context = context->user;
                      h.primID = *(uint *)((long)&local_8a8 + uVar47 * 4);
                      h.Ng.field_0.field_0.x = (float)*(undefined4 *)(local_808 + uVar47 * 4);
                      h.Ng.field_0.field_0.y = (float)*(undefined4 *)(local_7f8 + uVar47 * 4);
                      h.Ng.field_0.field_0.z = (float)*(undefined4 *)(local_7e8 + uVar47 * 4);
                      h.instID[0] = (args.context)->instID[0];
                      h.instPrimID[0] = (args.context)->instPrimID[0];
                      local_ad8 = ray->tfar;
                      ray->tfar = *(float *)(local_818 + uVar47 * 4);
                      local_adc = -1;
                      args.valid = &local_adc;
                      args.geometryUserPtr = pGVar18->userPtr;
                      args.hit = (RTCHitN *)&h;
                      args.N = 1;
                      args.ray = (RTCRayN *)ray;
                      if (pGVar18->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_002349aa:
                        if (pRVar19->filter != (RTCFilterFunctionN)0x0) {
                          if (((pRVar19->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                             (((pGVar18->field_8).field_0x2 & 0x40) != 0)) {
                            (*pRVar19->filter)(&args);
                            fVar91 = local_a78;
                            fVar170 = fStack_a74;
                            fVar66 = fStack_a70;
                            fVar54 = fStack_a6c;
                          }
                          if (*args.valid == 0) goto LAB_00234a00;
                        }
                        bVar37 = false;
                      }
                      else {
                        local_a58 = SUB84(ray,0);
                        fStack_a54 = (float)((ulong)ray >> 0x20);
                        local_ac8 = context;
                        (*pGVar18->occlusionFilterN)(&args);
                        ray = (Ray *)CONCAT44(fStack_a54,local_a58);
                        context = local_ac8;
                        fVar91 = local_a78;
                        fVar170 = fStack_a74;
                        fVar66 = fStack_a70;
                        fVar54 = fStack_a6c;
                        if (*args.valid != 0) goto LAB_002349aa;
LAB_00234a00:
                        ray->tfar = local_ad8;
                        uVar52 = uVar52 ^ 1L << (uVar47 & 0x3f);
                        bVar37 = true;
                      }
                    }
                  }
                  iVar40 = 0;
                  if (!bVar37) {
                    uVar47 = local_a90;
                    uVar48 = local_a80;
                    uVar49 = local_a88;
                    uVar51 = local_a98;
                    uVar41 = local_aa0;
                    if (bVar53) {
                      ray->tfar = -INFINITY;
                      iVar40 = 3;
                    }
                    goto LAB_00234a80;
                  }
                } while (uVar52 != 0);
                uVar52 = 0;
              }
            }
            iVar40 = 0;
            local_a30 = local_a30 + 1;
            bVar53 = local_a30 < local_a38;
            uVar47 = local_a90;
            uVar48 = local_a80;
            uVar49 = local_a88;
            uVar51 = local_a98;
            uVar41 = local_aa0;
          } while (local_a30 != local_a38);
        }
      }
LAB_00234a80:
      uVar52 = uVar41;
    } while (iVar40 != 3);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }